

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::outputStyleBoth(Binasc *this,ostream *out,istream *input)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  uchar asciiLine [256];
  
  iVar8 = 0;
  memset(asciiLine,0,0x100);
  bVar1 = std::istream::get();
  lVar5 = 0;
  while (iVar2 = (int)lVar5, ((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    if (iVar2 == 0) {
      asciiLine[0] = ';';
      std::operator<<(out,' ');
      iVar2 = 1;
    }
    uVar6 = (uint)bVar1;
    if (uVar6 < 0x10) {
      std::operator<<(out,'0');
    }
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = (ostream *)std::ostream::operator<<(out,uVar6);
    std::operator<<(poVar3,' ');
    lVar4 = (long)iVar2;
    asciiLine[lVar4] = ' ';
    iVar2 = isprint(uVar6);
    bVar7 = 0x20;
    if (iVar2 != 0) {
      bVar7 = bVar1;
    }
    iVar8 = iVar8 + 1;
    asciiLine[lVar4 + 1] = bVar7;
    asciiLine[lVar4 + 2] = ' ';
    lVar5 = lVar4 + 3;
    if (this->m_maxLineBytes <= iVar8) {
      std::operator<<(out,'\n');
      asciiLine[lVar4 + 3] = '\0';
      poVar3 = std::operator<<(out,(char *)asciiLine);
      std::operator<<(poVar3,"\n\n");
      iVar8 = 0;
      lVar5 = 0;
    }
    bVar1 = std::istream::get();
  }
  if (iVar8 != 0) {
    std::operator<<(out,'\n');
    asciiLine[iVar2] = '\0';
    poVar3 = std::operator<<(out,(char *)asciiLine);
    poVar3 = std::operator<<(poVar3,'\n');
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return 1;
}

Assistant:

int Binasc::outputStyleBoth(std::ostream& out, std::istream& input) {
	uchar asciiLine[256] = {0};    // storage for output line
	int currentByte = 0;           // current byte output in line
	int index = 0;                 // current character in asciiLine
	uchar ch;                      // current input byte

	ch = static_cast<uchar>(input.get());
	while (!input.eof()) {
		if (index == 0) {
			asciiLine[index++] = ';';
			out << ' ';
		}
		if (ch < 0x10) {
			out << '0';
		}
		out << std::hex << (int)ch << ' ';
		currentByte++;

		asciiLine[index++] = ' ';
		if (isprint(ch)) {
			asciiLine[index++] = ch;
		} else {
			asciiLine[index++] = ' ';
		}
		asciiLine[index++] = ' ';

		if (currentByte >= m_maxLineBytes) {
			out << '\n';
			asciiLine[index] = '\0';
			out << asciiLine << "\n\n";
			currentByte = 0;
			index = 0;
		}
		ch = static_cast<uchar>(input.get());
	}

	if (currentByte != 0) {
		out << '\n';
		asciiLine[index] = '\0';
		out << asciiLine << '\n' << std::endl;
	}

	return 1;
}